

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

void mjs::anon_unknown_33::make_immutable(object_ptr *o,property_attribute attr)

{
  bool bVar1;
  property_attribute attributes;
  object *this;
  long *plVar2;
  undefined8 *puVar3;
  void *pvVar4;
  pointer this_00;
  wstring_view local_80;
  value local_70;
  vector<mjs::string,_std::allocator<mjs::string>_> local_48;
  
  this = (object *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  object::own_property_names(&local_48,this,false);
  for (this_00 = local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    local_70._0_16_ = string::view(this_00);
    attributes = (**(code **)(*plVar2 + 0x30))(plVar2,&local_70);
    bVar1 = has_attributes(attributes,attr);
    if (!bVar1) {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      local_80 = string::view(this_00);
      (**(code **)*puVar3)(&local_70,puVar3,&local_80);
      (**(code **)(*plVar2 + 0x28))(plVar2,this_00,&local_70,attributes | attr);
      value::~value(&local_70);
    }
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_48);
  pvVar4 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  *(undefined1 *)((long)pvVar4 + 0x1c) = 0;
  return;
}

Assistant:

void make_immutable(const object_ptr& o, property_attribute attr) {
    for (const auto& p : o->own_property_names(false)) {
        const auto attrs = o->own_property_attributes(p.view());
        if (!has_attributes(attrs, attr)) {
            o->redefine_own_property(p, o->get(p.view()), attrs | attr);
        }
    }
    o->prevent_extensions();
}